

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Option<const_int_&> __thiscall
Lib::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
::tryGet(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_Lib::DefaultHash>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  uint uVar6;
  uint *puVar7;
  
  pcVar3 = (in_RDX->_M_dataplus)._M_p;
  cVar4 = *pcVar3;
  if (cVar4 == '\0') {
    uVar6 = 0x811c9dc5;
  }
  else {
    uVar6 = 0x811c9dc5;
    do {
      pcVar3 = pcVar3 + 1;
      uVar6 = ((int)cVar4 ^ uVar6) * 0x1000193;
      cVar4 = *pcVar3;
    } while (cVar4 != '\0');
  }
  uVar6 = uVar6 + (uVar6 == 0);
  lVar5 = ((ulong)uVar6 % (ulong)*(uint *)&(key->_M_dataplus)._M_p) * 0x30;
  uVar2 = *(uint *)(key->_M_string_length + lVar5);
  if (uVar2 != 0) {
    puVar7 = (uint *)(key->_M_string_length + lVar5);
    do {
      if ((uVar2 == uVar6) &&
         (bVar1 = DefaultHash::equals<std::__cxx11::string>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (puVar7 + 2),in_RDX), bVar1)) {
        puVar7 = puVar7 + 10;
        goto LAB_00625b76;
      }
      puVar7 = puVar7 + 0xc;
      if (puVar7 == (uint *)(key->field_2)._M_allocated_capacity) {
        puVar7 = (uint *)key->_M_string_length;
      }
      uVar2 = *puVar7;
    } while (uVar2 != 0);
  }
  this->_capacity = 0;
  this->_noOfEntries = 0;
  puVar7 = (uint *)0x0;
LAB_00625b76:
  *(uint **)this = puVar7;
  return (OptionBase<const_int_&>)(OptionBase<const_int_&>)this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }